

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O3

void ScaleFilterCols_16_C(uint16_t *dst_ptr,uint16_t *src_ptr,int dst_width,int x,int dx)

{
  uint uVar1;
  int iVar2;
  
  if (1 < dst_width) {
    iVar2 = 0;
    do {
      *dst_ptr = (short)(((uint)src_ptr[(long)(x >> 0x10) + 1] - (uint)src_ptr[x >> 0x10]) *
                         (x & 0xffffU) + 0x8000 >> 0x10) + src_ptr[x >> 0x10];
      uVar1 = x + dx;
      dst_ptr[1] = (short)(((uint)src_ptr[(long)((int)uVar1 >> 0x10) + 1] -
                           (uint)src_ptr[(int)uVar1 >> 0x10]) * (uVar1 & 0xffff) + 0x8000 >> 0x10) +
                   src_ptr[(int)uVar1 >> 0x10];
      x = uVar1 + dx;
      dst_ptr = dst_ptr + 2;
      iVar2 = iVar2 + 2;
    } while (iVar2 < dst_width + -1);
  }
  if ((dst_width & 1U) != 0) {
    *dst_ptr = (short)(((uint)src_ptr[(long)(x >> 0x10) + 1] - (uint)src_ptr[x >> 0x10]) *
                       (x & 0xffffU) + 0x8000 >> 0x10) + src_ptr[x >> 0x10];
  }
  return;
}

Assistant:

void ScaleFilterCols_16_C(uint16_t* dst_ptr,
                          const uint16_t* src_ptr,
                          int dst_width,
                          int x,
                          int dx) {
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int xi = x >> 16;
    int a = src_ptr[xi];
    int b = src_ptr[xi + 1];
    dst_ptr[0] = BLENDER(a, b, x & 0xffff);
    x += dx;
    xi = x >> 16;
    a = src_ptr[xi];
    b = src_ptr[xi + 1];
    dst_ptr[1] = BLENDER(a, b, x & 0xffff);
    x += dx;
    dst_ptr += 2;
  }
  if (dst_width & 1) {
    int xi = x >> 16;
    int a = src_ptr[xi];
    int b = src_ptr[xi + 1];
    dst_ptr[0] = BLENDER(a, b, x & 0xffff);
  }
}